

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O0

Box2i anon_unknown.dwarf_1e4dfb::writefile
                (Schema *scheme,FrameBuffer *buf,bool tiny,bool allowNonfinite)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  undefined4 *puVar7;
  char *pcVar8;
  byte in_CL;
  byte bVar9;
  FrameBuffer *in_RDX;
  Vec2<int> extraout_RDX;
  long in_RSI;
  Vec2<int> in_RDI;
  byte in_R8B;
  Box2i BVar10;
  OutputFile f;
  FrameBuffer dummy2;
  FrameBuffer dummy1;
  Header hdr;
  int width;
  int height;
  Box<Imath_3_2::Vec2<int>_> *pBVar11;
  undefined8 in_stack_fffffffffffffd90;
  Box<Imath_3_2::Vec2<int>_> *this;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffffda4;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  undefined1 local_130 [88];
  Box<Imath_3_2::Vec2<int>_> local_d8 [3];
  Box<Imath_3_2::Vec2<int>_> local_a8 [4];
  Vec2<float> local_68;
  Header local_60 [6];
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  FrameBuffer *in_stack_ffffffffffffffa8;
  PixelType *in_stack_ffffffffffffffb0;
  char **in_stack_ffffffffffffffb8;
  char **in_stack_ffffffffffffffc0;
  Header *in_stack_ffffffffffffffc8;
  undefined4 uVar13;
  undefined2 in_stack_ffffffffffffffe4;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffd90 >> 0x20);
  bVar9 = in_CL & 1;
  bVar1 = in_R8B & 1;
  uVar13 = 0x80;
  Imath_3_2::Vec2<float>::Vec2(&local_68,0.0,0.0);
  Imf_3_4::Header::Header(local_60,0x80,0x80,1.0,(Vec2 *)&local_68,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  iVar2 = random_int(iVar4);
  piVar5 = (int *)Imf_3_4::Header::dataWindow();
  *piVar5 = iVar2 + -100;
  iVar2 = random_int(iVar4);
  lVar6 = Imf_3_4::Header::dataWindow();
  *(int *)(lVar6 + 4) = iVar2 + -100;
  if ((bVar9 & 1) == 0) {
    piVar5 = (int *)Imf_3_4::Header::dataWindow();
    iVar2 = *piVar5;
    iVar3 = random_int(iVar4);
    lVar6 = Imf_3_4::Header::dataWindow();
    *(int *)(lVar6 + 8) = iVar2 + 0x40 + iVar3;
    lVar6 = Imf_3_4::Header::dataWindow();
    iVar2 = *(int *)(lVar6 + 4);
    iVar4 = random_int(iVar4);
    lVar6 = Imf_3_4::Header::dataWindow();
    *(int *)(lVar6 + 0xc) = iVar2 + 0x40 + iVar4;
  }
  else {
    piVar5 = (int *)Imf_3_4::Header::dataWindow();
    iVar2 = *piVar5;
    iVar3 = random_int(iVar4);
    lVar6 = Imf_3_4::Header::dataWindow();
    *(int *)(lVar6 + 8) = iVar2 + 1 + iVar3;
    lVar6 = Imf_3_4::Header::dataWindow();
    iVar2 = *(int *)(lVar6 + 4);
    iVar4 = random_int(iVar4);
    lVar6 = Imf_3_4::Header::dataWindow();
    *(int *)(lVar6 + 0xc) = iVar2 + 1 + iVar4;
  }
  puVar7 = (undefined4 *)Imf_3_4::Header::compression();
  *puVar7 = 2;
  pBVar11 = local_a8;
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x1e3afd);
  this = local_d8;
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x1e3b0f);
  uVar12 = 1;
  setupBuffer(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
              in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
              (FrameBuffer *)
              CONCAT17(bVar9,CONCAT16(bVar1,CONCAT24(in_stack_ffffffffffffffe4,uVar13))),in_RDX,
              (int)in_RSI,(bool)in_stack_ffffffffffffffa7,(bool)in_stack_ffffffffffffffa6);
  Imf_3_4::Header::channels();
  Imf_3_4::ChannelList::operator=((ChannelList *)this,(ChannelList *)pBVar11);
  Imf_3_4::ChannelList::~ChannelList((ChannelList *)0x1e3ba9);
  if (*(long *)(in_RSI + 0x20) != 0) {
    (anonymous_namespace)::Schema::views_abi_cxx11_
              ((Schema *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    Imf_3_4::addMultiView(local_60,(vector *)(local_130 + 0x10));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffda4,uVar12));
  }
  pcVar8 = (char *)std::__cxx11::string::c_str();
  remove(pcVar8);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile((OutputFile *)local_130,pcVar8,local_60,iVar2);
  Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)local_130);
  Imf_3_4::Header::dataWindow();
  Imf_3_4::Header::dataWindow();
  Imf_3_4::OutputFile::writePixels((int)local_130);
  Imf_3_4::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box(this,pBVar11);
  Imf_3_4::OutputFile::~OutputFile((OutputFile *)local_130);
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1e3d5b);
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1e3d68);
  Imf_3_4::Header::~Header(local_60);
  BVar10.max = extraout_RDX;
  BVar10.min = in_RDI;
  return BVar10;
}

Assistant:

Box2i
writefile (Schema& scheme, FrameBuffer& buf, bool tiny, bool allowNonfinite)
{
    const int height = 128;
    const int width  = 128;

    Header hdr (width, height, 1);

    //min values in range [-100,100]
    hdr.dataWindow ().min.x = random_int (201) - 100;
    hdr.dataWindow ().min.y = random_int (201) - 100;

    // in tiny mode, make image up to 14*14 pixels (less than two SSE instructions)
    if (tiny)
    {
        hdr.dataWindow ().max.x = hdr.dataWindow ().min.x + 1 + random_int (14);
        hdr.dataWindow ().max.y = hdr.dataWindow ().min.y + 1 + random_int (14);
    }
    else
    {
        // in normal mode, make chunky images
        hdr.dataWindow ().max.x =
            hdr.dataWindow ().min.x + 64 + random_int (400);
        hdr.dataWindow ().max.y =
            hdr.dataWindow ().min.y + 64 + random_int (400);
    }

    hdr.compression () = ZIPS_COMPRESSION;

    FrameBuffer dummy1, dummy2;

    hdr.channels () = setupBuffer (
        hdr,
        scheme._active,
        scheme._passive,
        scheme._types,
        buf,
        dummy1,
        dummy2,
        scheme._banks,
        true,
        allowNonfinite);

    if (scheme._views) { addMultiView (hdr, scheme.views ()); }

    remove (filename.c_str ());
    OutputFile f (filename.c_str (), hdr);
    f.setFrameBuffer (buf);
    f.writePixels (hdr.dataWindow ().max.y - hdr.dataWindow ().min.y + 1);

    return hdr.dataWindow ();
}